

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O2

QList<QUrl> * __thiscall QMimeData::urls(QList<QUrl> *__return_storage_ptr__,QMimeData *this)

{
  QMimeDataPrivate *this_00;
  int iVar1;
  long lVar2;
  undefined8 this_01;
  long in_FS_OFFSET;
  undefined1 local_78 [16];
  anon_union_24_3_e3d07ef4_for_data local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  textUriListLiteral();
  QMetaType::QMetaType((QMetaType *)(local_78 + 8),9);
  QMimeDataPrivate::retrieveTypedData
            ((QVariant *)&local_48,this_00,(QString *)&local_68,(QMetaType)local_78._8_8_);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QUrl *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_68.shared = (PrivateShared *)::QVariant::metaType((QVariant *)&local_48);
  iVar1 = QMetaType::registerHelper((QMetaType *)&local_68.shared);
  if (iVar1 == 0x11) {
    ::QVariant::toUrl((QVariant *)&local_68);
    QList<QUrl>::emplaceBack<QUrl>(__return_storage_ptr__,(QUrl *)&local_68.shared);
    QUrl::~QUrl((QUrl *)&local_68.shared);
  }
  else {
    local_68.shared = (PrivateShared *)::QVariant::metaType((QVariant *)&local_48);
    iVar1 = QMetaType::registerHelper((QMetaType *)&local_68.shared);
    if (iVar1 == 9) {
      local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toList((QVariantList *)&local_68,(QVariant *)&local_48);
      this_01 = local_68._8_8_;
      for (lVar2 = local_68._16_8_ << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
        local_78._0_8_ = ::QVariant::metaType((QVariant *)this_01);
        iVar1 = QMetaType::registerHelper((QMetaType *)local_78);
        if (iVar1 == 0x11) {
          ::QVariant::toUrl((QVariant *)local_78);
          QList<QUrl>::emplaceBack<QUrl>(__return_storage_ptr__,(QUrl *)local_78);
          QUrl::~QUrl((QUrl *)local_78);
        }
        this_01 = this_01 + 0x20;
      }
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_68);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QUrl> QMimeData::urls() const
{
    Q_D(const QMimeData);
    QVariant data = d->retrieveTypedData(textUriListLiteral(), QMetaType(QMetaType::QVariantList));
    QList<QUrl> urls;
    if (data.metaType().id() == QMetaType::QUrl)
        urls.append(data.toUrl());
    else if (data.metaType().id() == QMetaType::QVariantList) {
        const QList<QVariant> list = data.toList();
        for (const auto &element : list) {
            if (element.metaType().id() == QMetaType::QUrl)
                urls.append(element.toUrl());
        }
    }
    return urls;
}